

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractscrollarea.cpp
# Opt level: O3

void QtMWidgets::AbstractScrollArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ScrollIndicatorPolicy *pSVar1;
  undefined8 uVar2;
  ScrollIndicatorPolicy SVar3;
  QColor *pQVar4;
  QColor QVar5;
  
  if (_c == WriteProperty) {
    if (4 < (uint)_id) {
      return;
    }
    pQVar4 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setIndicatorColor((AbstractScrollArea *)_o,pQVar4);
      return;
    case 1:
      setVerticalScrollIndicatorPolicy((AbstractScrollArea *)_o,pQVar4->cspec);
      return;
    case 2:
      setHorizontalScrollIndicatorPolicy((AbstractScrollArea *)_o,pQVar4->cspec);
      return;
    case 3:
      setBlurColor((AbstractScrollArea *)_o,pQVar4);
      return;
    case 4:
      setBlurPolicy((AbstractScrollArea *)_o,pQVar4->cspec);
      return;
    }
  }
  if (_c == ReadProperty) {
    if ((uint)_id < 5) {
      pSVar1 = (ScrollIndicatorPolicy *)*_a;
      switch(_id) {
      case 0:
        QVar5 = indicatorColor((AbstractScrollArea *)_o);
        *(long *)pSVar1 = QVar5._0_8_;
        pSVar1[2] = QVar5.ct._4_4_;
        *(short *)(pSVar1 + 3) = QVar5.ct._8_2_;
        return;
      case 1:
        SVar3 = verticalScrollIndicatorPolicy((AbstractScrollArea *)_o);
        break;
      case 2:
        SVar3 = horizontalScrollIndicatorPolicy((AbstractScrollArea *)_o);
        break;
      case 3:
        pQVar4 = blurColor((AbstractScrollArea *)_o);
        uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
        *(undefined8 *)pSVar1 = *(undefined8 *)pQVar4;
        *(undefined8 *)((long)pSVar1 + 6) = uVar2;
        return;
      case 4:
        SVar3 = blurPolicy((AbstractScrollArea *)_o);
      }
      *pSVar1 = SVar3;
      return;
    }
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    _q_animateScrollIndicators((AbstractScrollArea *)_o);
    return;
  case 1:
    _q_kineticScrolling((AbstractScrollArea *)_o,*_a[1],*_a[2]);
    return;
  case 2:
    _q_kineticScrollingAboutToStart((AbstractScrollArea *)_o);
    return;
  case 3:
    _q_kineticScrollingFinished((AbstractScrollArea *)_o);
    return;
  case 4:
    _q_horBlurAnim((AbstractScrollArea *)_o,(QVariant *)_a[1]);
    return;
  case 5:
    _q_horBlurAnimFinished((AbstractScrollArea *)_o);
    return;
  case 6:
    _q_vertBlurAnim((AbstractScrollArea *)_o,(QVariant *)_a[1]);
    return;
  case 7:
    _q_vertBlurAnimFinished((AbstractScrollArea *)_o);
    return;
  case 8:
    _q_startBlurAnim((AbstractScrollArea *)_o);
    return;
  default:
    return;
  }
}

Assistant:

void QtMWidgets::AbstractScrollArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_animateScrollIndicators(); break;
        case 1: _t->_q_kineticScrolling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->_q_kineticScrollingAboutToStart(); break;
        case 3: _t->_q_kineticScrollingFinished(); break;
        case 4: _t->_q_horBlurAnim((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 5: _t->_q_horBlurAnimFinished(); break;
        case 6: _t->_q_vertBlurAnim((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 7: _t->_q_vertBlurAnimFinished(); break;
        case 8: _t->_q_startBlurAnim(); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QColor*>(_v) = _t->indicatorColor(); break;
        case 1: *reinterpret_cast< ScrollIndicatorPolicy*>(_v) = _t->verticalScrollIndicatorPolicy(); break;
        case 2: *reinterpret_cast< ScrollIndicatorPolicy*>(_v) = _t->horizontalScrollIndicatorPolicy(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->blurColor(); break;
        case 4: *reinterpret_cast< BlurPolicy*>(_v) = _t->blurPolicy(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        case 1: _t->setVerticalScrollIndicatorPolicy(*reinterpret_cast< ScrollIndicatorPolicy*>(_v)); break;
        case 2: _t->setHorizontalScrollIndicatorPolicy(*reinterpret_cast< ScrollIndicatorPolicy*>(_v)); break;
        case 3: _t->setBlurColor(*reinterpret_cast< QColor*>(_v)); break;
        case 4: _t->setBlurPolicy(*reinterpret_cast< BlurPolicy*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}